

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathNameFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlNodeSetPtr pxVar1;
  xmlNodePtr val;
  xmlXPathObjectPtr pxVar2;
  xmlXPathObjectPtr pxVar3;
  xmlChar *pxVar4;
  int error;
  undefined4 in_register_00000034;
  xmlChar *pxVar5;
  
  pxVar5 = (xmlChar *)CONCAT44(in_register_00000034,nargs);
  if (nargs == 0) {
    pxVar2 = xmlXPathCacheNewNodeSet(ctxt->context,ctxt->context->node);
    valuePush(ctxt,pxVar2);
    pxVar5 = &DAT_00000001;
  }
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if ((int)pxVar5 != 1) {
    error = 0xc;
LAB_001e73ac:
    xmlXPathErr(ctxt,error);
    return;
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    error = 0x17;
    goto LAB_001e73ac;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((ctxt->value->type | XPATH_USERS) != XPATH_XSLT_TREE)) {
    error = 0xb;
    goto LAB_001e73ac;
  }
  pxVar2 = valuePop(ctxt);
  pxVar1 = pxVar2->nodesetval;
  if ((pxVar1 == (xmlNodeSetPtr)0x0) || (pxVar1->nodeNr == 0)) {
LAB_001e737a:
    pxVar3 = xmlXPathCacheNewCString(ctxt->context,(char *)pxVar5);
  }
  else {
    val = *pxVar1->nodeTab;
    if (1 < val->type - XML_ELEMENT_NODE) {
      pxVar3 = xmlXPathCacheNewNodeSet(ctxt->context,val);
      valuePush(ctxt,pxVar3);
      xmlXPathLocalNameFunction(ctxt,1);
      goto LAB_001e73da;
    }
    pxVar5 = val->name;
    if (*pxVar5 == ' ') goto LAB_001e737a;
    if ((val->ns != (xmlNs *)0x0) && (pxVar4 = val->ns->prefix, pxVar4 != (xmlChar *)0x0)) {
      pxVar4 = xmlBuildQName(pxVar5,pxVar4,(xmlChar *)0x0,0);
      pxVar5 = (*pxVar2->nodesetval->nodeTab)->name;
      if (pxVar4 == pxVar5) {
        pxVar4 = xmlStrdup(pxVar5);
      }
      if (pxVar4 == (xmlChar *)0x0) {
        xmlXPathErr(ctxt,0xf);
        return;
      }
      pxVar3 = xmlXPathCacheWrapString(ctxt->context,pxVar4);
      valuePush(ctxt,pxVar3);
      goto LAB_001e73da;
    }
    pxVar3 = xmlXPathCacheNewString(ctxt->context,pxVar5);
  }
  valuePush(ctxt,pxVar3);
LAB_001e73da:
  xmlXPathReleaseObject(ctxt->context,pxVar2);
  return;
}

Assistant:

static void
xmlXPathNameFunction(xmlXPathParserContextPtr ctxt, int nargs)
{
    xmlXPathObjectPtr cur;

    if (nargs == 0) {
	valuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt->context,
	    ctxt->context->node));
        nargs = 1;
    }

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
        ((ctxt->value->type != XPATH_NODESET) &&
         (ctxt->value->type != XPATH_XSLT_TREE)))
        XP_ERROR(XPATH_INVALID_TYPE);
    cur = valuePop(ctxt);

    if ((cur->nodesetval == NULL) || (cur->nodesetval->nodeNr == 0)) {
        valuePush(ctxt, xmlXPathCacheNewCString(ctxt->context, ""));
    } else {
        int i = 0;              /* Should be first in document order !!!!! */

        switch (cur->nodesetval->nodeTab[i]->type) {
            case XML_ELEMENT_NODE:
            case XML_ATTRIBUTE_NODE:
		if (cur->nodesetval->nodeTab[i]->name[0] == ' ')
		    valuePush(ctxt,
			xmlXPathCacheNewCString(ctxt->context, ""));
		else if ((cur->nodesetval->nodeTab[i]->ns == NULL) ||
                         (cur->nodesetval->nodeTab[i]->ns->prefix == NULL)) {
		    valuePush(ctxt,
		        xmlXPathCacheNewString(ctxt->context,
			    cur->nodesetval->nodeTab[i]->name));
		} else {
		    xmlChar *fullname;

		    fullname = xmlBuildQName(cur->nodesetval->nodeTab[i]->name,
				     cur->nodesetval->nodeTab[i]->ns->prefix,
				     NULL, 0);
		    if (fullname == cur->nodesetval->nodeTab[i]->name)
			fullname = xmlStrdup(cur->nodesetval->nodeTab[i]->name);
		    if (fullname == NULL) {
			XP_ERROR(XPATH_MEMORY_ERROR);
		    }
		    valuePush(ctxt, xmlXPathCacheWrapString(
			ctxt->context, fullname));
                }
                break;
            default:
		valuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt->context,
		    cur->nodesetval->nodeTab[i]));
                xmlXPathLocalNameFunction(ctxt, 1);
        }
    }
    xmlXPathReleaseObject(ctxt->context, cur);
}